

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::BufferStream::read(BufferStream *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  undefined4 in_register_00000034;
  size_type len_read;
  size_t size_local;
  char *ptr_local;
  BufferStream *this_local;
  
  lVar1 = std::__cxx11::string::copy
                    ((char *)&this->buffer,CONCAT44(in_register_00000034,__fd),(ulong)__buf);
  this->position = lVar1 + this->position;
  return lVar1;
}

Assistant:

inline ssize_t BufferStream::read(char *ptr, size_t size) {
#if defined(_MSC_VER) && _MSC_VER <= 1900
  auto len_read = buffer._Copy_s(ptr, size, size, position);
#else
  auto len_read = buffer.copy(ptr, size, position);
#endif
  position += static_cast<size_t>(len_read);
  return static_cast<ssize_t>(len_read);
}